

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long local_48;
  long local_40 [2];
  
  uVar4 = (ulong)(uint)count;
  iVar6 = this->stream_count_;
  while (0 < iVar6) {
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])(*this->streams_,uVar4);
    if ((char)iVar2 != '\0') break;
    lVar5 = CONCAT44(extraout_var,iVar1) + (long)(int)uVar4;
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    local_48 = lVar5;
    local_40[0] = CONCAT44(extraout_var_00,iVar1);
    psVar3 = absl::lts_20240722::log_internal::Check_LTImpl<long,long>
                       (local_40,&local_48,"final_byte_count < target_byte_count");
    if (psVar3 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl.cc"
                 ,0x145,psVar3->_M_string_length,(psVar3->_M_dataplus)._M_p);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_40);
    }
    this->bytes_retired_ = this->bytes_retired_ + CONCAT44(extraout_var_00,iVar1);
    this->streams_ = this->streams_ + 1;
    iVar6 = this->stream_count_ + -1;
    this->stream_count_ = iVar6;
    uVar4 = (ulong)(uint)((int)lVar5 - iVar1);
  }
  return 0 < iVar6;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64_t target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64_t final_byte_count = streams_[0]->ByteCount();
    ABSL_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}